

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScaledBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btScaledBvhTriangleMeshShape::getAabb
          (btScaledBvhTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btVector3 *pbVar1;
  btScalar *pbVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btTransform *in_RSI;
  long in_RDI;
  btVector3 bVar3;
  btVector3 extent;
  btVector3 center;
  btMatrix3x3 abs_b;
  btVector3 localCenter;
  btScalar margin;
  btVector3 localHalfExtents;
  btVector3 tmpLocalAabbMax;
  btVector3 tmpLocalAabbMin;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  undefined4 in_stack_fffffffffffffe38;
  btScalar *in_stack_fffffffffffffe40;
  btVector3 *this_00;
  btVector3 *in_stack_fffffffffffffe48;
  btVector3 *in_stack_fffffffffffffe50;
  btVector3 *v1;
  btMatrix3x3 *this_01;
  btVector3 *this_02;
  btVector3 *in_stack_fffffffffffffe68;
  btTransform *in_stack_fffffffffffffe70;
  btScalar local_174;
  btScalar bVar4;
  btScalar bVar5;
  btScalar local_164;
  btScalar local_15c;
  btScalar local_154;
  btScalar local_14c;
  btMatrix3x3 local_f4;
  undefined8 local_c4;
  undefined8 local_bc;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 local_a8;
  btVector3 local_a0;
  btScalar local_90;
  undefined8 local_8c;
  undefined8 local_84;
  undefined4 local_7c;
  btVector3 local_78;
  btVector3 local_68;
  btVector3 local_58;
  btVector3 local_48;
  btVector3 local_38;
  undefined8 *local_20;
  undefined8 *local_18;
  btTransform *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pbVar1 = btTriangleMeshShape::getLocalAabbMin(*(btTriangleMeshShape **)(in_RDI + 0x30));
  local_38.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
  local_38.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
  pbVar1 = btTriangleMeshShape::getLocalAabbMax(*(btTriangleMeshShape **)(in_RDI + 0x30));
  local_48.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
  bVar3 = ::operator*(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_58.m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_58.m_floats._0_8_ = bVar3.m_floats._0_8_;
  bVar3 = ::operator*(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_68.m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_68.m_floats._0_8_ = bVar3.m_floats._0_8_;
  pbVar2 = btVector3::getX((btVector3 *)(in_RDI + 0x20));
  if (*pbVar2 < 0.0) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    local_14c = *pbVar2;
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    local_14c = *pbVar2;
  }
  pbVar2 = btVector3::operator_cast_to_float_(&local_38);
  *pbVar2 = local_14c;
  pbVar2 = btVector3::getY((btVector3 *)(in_RDI + 0x20));
  if (*pbVar2 < 0.0) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    local_154 = pbVar2[1];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    local_154 = pbVar2[1];
  }
  pbVar2 = btVector3::operator_cast_to_float_(&local_38);
  pbVar2[1] = local_154;
  pbVar2 = btVector3::getZ((btVector3 *)(in_RDI + 0x20));
  if (*pbVar2 < 0.0) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    local_15c = pbVar2[2];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    local_15c = pbVar2[2];
  }
  pbVar2 = btVector3::operator_cast_to_float_(&local_38);
  pbVar2[2] = local_15c;
  pbVar2 = btVector3::getX((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar2) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    local_164 = *pbVar2;
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    local_164 = *pbVar2;
  }
  pbVar2 = btVector3::operator_cast_to_float_(&local_48);
  *pbVar2 = local_164;
  pbVar2 = btVector3::getY((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar2) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    bVar4 = pbVar2[1];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    bVar4 = pbVar2[1];
  }
  bVar5 = bVar4;
  pbVar2 = btVector3::operator_cast_to_float_(&local_48);
  pbVar2[1] = bVar4;
  pbVar2 = btVector3::getZ((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar2) {
    pbVar2 = btVector3::operator_cast_to_float_(&local_68);
    local_174 = pbVar2[2];
  }
  else {
    pbVar2 = btVector3::operator_cast_to_float_(&local_58);
    local_174 = pbVar2[2];
  }
  pbVar1 = &local_48;
  pbVar2 = btVector3::operator_cast_to_float_(pbVar1);
  pbVar2[2] = local_174;
  local_7c = 0x3f000000;
  v1 = &local_38;
  bVar3 = operator-(v1,pbVar1);
  local_84 = bVar3.m_floats._8_8_;
  local_8c = bVar3.m_floats._0_8_;
  bVar3 = ::operator*(in_stack_fffffffffffffe40,
                      (btVector3 *)CONCAT44(local_174,in_stack_fffffffffffffe38));
  local_78.m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_78.m_floats._0_8_ = bVar3.m_floats._0_8_;
  local_90 = (btScalar)(**(code **)(**(long **)(in_RDI + 0x30) + 0x60))();
  this_00 = &local_a0;
  btVector3::btVector3(this_00,&local_90,&local_90,&local_90);
  this_02 = &local_78;
  btVector3::operator+=(this_02,this_00);
  local_b4 = 0x3f000000;
  bVar3 = operator+(v1,pbVar1);
  local_bc = bVar3.m_floats._8_8_;
  local_c4 = bVar3.m_floats._0_8_;
  bVar3 = ::operator*(this_00->m_floats,(btVector3 *)CONCAT44(local_174,in_stack_fffffffffffffe38));
  local_a8 = bVar3.m_floats._8_8_;
  local_b0 = bVar3.m_floats._0_8_;
  btTransform::getBasis(local_10);
  this_01 = &local_f4;
  btMatrix3x3::absolute((btMatrix3x3 *)CONCAT44(bVar5,bVar4));
  btTransform::operator()(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  btMatrix3x3::operator[](this_01,0);
  btMatrix3x3::operator[](this_01,1);
  btMatrix3x3::operator[](this_01,2);
  btVector3::dot3(this_02,this_01->m_el,v1,pbVar1);
  bVar3 = operator-(v1,pbVar1);
  *local_18 = bVar3.m_floats._0_8_;
  local_18[1] = bVar3.m_floats._8_8_;
  bVar3 = operator+(v1,pbVar1);
  *local_20 = bVar3.m_floats._0_8_;
  local_20[1] = bVar3.m_floats._8_8_;
  return;
}

Assistant:

void	btScaledBvhTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{
	btVector3 localAabbMin = m_bvhTriMeshShape->getLocalAabbMin();
	btVector3 localAabbMax = m_bvhTriMeshShape->getLocalAabbMax();

	btVector3 tmpLocalAabbMin = localAabbMin * m_localScaling;
	btVector3 tmpLocalAabbMax = localAabbMax * m_localScaling;

	localAabbMin[0] = (m_localScaling.getX() >= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMin[1] = (m_localScaling.getY() >= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMin[2] = (m_localScaling.getZ() >= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];
	localAabbMax[0] = (m_localScaling.getX() <= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMax[1] = (m_localScaling.getY() <= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMax[2] = (m_localScaling.getZ() <= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];

	btVector3 localHalfExtents = btScalar(0.5)*(localAabbMax-localAabbMin);
	btScalar margin = m_bvhTriMeshShape->getMargin();
	localHalfExtents += btVector3(margin,margin,margin);
	btVector3 localCenter = btScalar(0.5)*(localAabbMax+localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;

}